

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSep.h
# Opt level: O1

StreamSep * __thiscall
Hpipe::StreamSepMaker::operator<<
          (StreamSep *__return_storage_ptr__,StreamSepMaker *this,char (*val) [68])

{
  size_type sVar1;
  ostream *poVar2;
  size_t sVar3;
  
  sVar1 = (this->first_beg)._M_string_length;
  if (sVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->stream,(this->beg)._M_dataplus._M_p,(this->beg)._M_string_length);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->stream,(this->first_beg)._M_dataplus._M_p,sVar1);
    (this->first_beg)._M_string_length = 0;
    *(this->first_beg)._M_dataplus._M_p = '\0';
  }
  poVar2 = this->stream;
  sVar3 = strlen(*val);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,*val,sVar3);
  StreamSep::StreamSep(__return_storage_ptr__,this->stream,&this->sep,&this->end);
  return __return_storage_ptr__;
}

Assistant:

StreamSep operator<<( const T &val ) {
        if( first_beg.size() ) {
            *stream << first_beg;
            first_beg.clear();
        } else
            *stream << beg;
        *stream << val;
        return StreamSep( stream, sep, end );
    }